

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorted_block.cpp
# Opt level: O2

unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true> __thiscall
duckdb::SortedBlock::CreateSlice(SortedBlock *this,idx_t start,idx_t end,idx_t *entry_idx)

{
  _Head_base<0UL,_duckdb::SortedData_*,_false> __p;
  unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>_> __p_00;
  pointer pSVar1;
  reference pvVar2;
  pointer pRVar3;
  pointer pSVar4;
  size_type __n;
  pointer in_R8;
  idx_t __n_00;
  idx_t end_entry_index;
  idx_t start_entry_index;
  idx_t end_block_index;
  idx_t start_block_index;
  _Head_base<0UL,_duckdb::SortedData_*,_false> local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_70;
  pointer local_68;
  pointer local_60;
  undefined1 local_58;
  undefined1 uStack_57;
  undefined6 uStack_56;
  ulong local_50;
  idx_t local_48;
  idx_t *local_40;
  pointer local_38;
  
  local_68 = in_R8;
  local_40 = entry_idx;
  local_38 = (pointer)end;
  GlobalToLocalIndex((SortedBlock *)start,(idx_t *)&stack0xffffffffffffffc8,&stack0xffffffffffffffb8
                     ,(idx_t *)&stack0xffffffffffffffa8);
  GlobalToLocalIndex((SortedBlock *)start,(idx_t *)&stack0xffffffffffffffc0,&stack0xffffffffffffffb0
                     ,(idx_t *)&stack0xffffffffffffffa0);
  make_uniq<duckdb::SortedBlock,duckdb::BufferManager&,duckdb::GlobalSortState&>
            ((duckdb *)this,*(BufferManager **)(start + 0x28),*(GlobalSortState **)(start + 0x30));
  for (__n_00 = local_48; __n_00 <= local_50; __n_00 = __n_00 + 1) {
    pSVar1 = unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>::
             operator->((unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>
                         *)this);
    pvVar2 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
             ::get<true>((vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                          *)start,__n_00);
    unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::operator->
              (pvVar2);
    RowDataBlock::Copy((RowDataBlock *)&stack0xffffffffffffff88);
    ::std::
    vector<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>,std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>>
              ((vector<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>,std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>>>
                *)pSVar1,
               (unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true> *)
               &stack0xffffffffffffff88);
    ::std::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>_>::~unique_ptr
              ((unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>_> *)
               &stack0xffffffffffffff88);
  }
  for (__n = 0; local_48 != __n; __n = __n + 1) {
    local_78._M_head_impl = (SortedData *)0x0;
    _Stack_70._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    pvVar2 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
             ::get<true>((vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                          *)start,__n);
    pRVar3 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
             operator->(pvVar2);
    shared_ptr<duckdb::BlockHandle,_true>::operator=
              (&pRVar3->block,(shared_ptr<duckdb::BlockHandle,_true> *)&stack0xffffffffffffff88);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&stack0xffffffffffffff90);
  }
  local_68->id_ = local_58;
  local_68->physical_type_ = uStack_57;
  *(undefined6 *)&local_68->field_0x2 = uStack_56;
  pSVar1 = unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>::
           operator->((unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>
                       *)this);
  pvVar2 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
           ::back(&pSVar1->radix_sorting_data);
  pRVar3 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
           operator->(pvVar2);
  pRVar3->count = (idx_t)local_60;
  if (*(char *)(*(long *)(start + 0x38) + 0x50) == '\0') {
    pSVar4 = unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>,_true>::
             operator->((unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>,_true>
                         *)(start + 0x18));
    SortedData::CreateSlice((SortedData *)&stack0xffffffffffffff88,(idx_t)pSVar4,local_48,local_50);
    pSVar1 = unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>::
             operator->((unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>
                         *)this);
    __p._M_head_impl = local_78._M_head_impl;
    local_78._M_head_impl = (SortedData *)0x0;
    ::std::__uniq_ptr_impl<duckdb::SortedData,_std::default_delete<duckdb::SortedData>_>::reset
              ((__uniq_ptr_impl<duckdb::SortedData,_std::default_delete<duckdb::SortedData>_> *)
               &pSVar1->blob_sorting_data,__p._M_head_impl);
    ::std::unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>_>::~unique_ptr
              ((unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>_> *)
               &stack0xffffffffffffff88);
  }
  pSVar4 = unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>,_true>::operator->
                     ((unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>,_true>
                       *)(start + 0x20));
  SortedData::CreateSlice((SortedData *)&stack0xffffffffffffff88,(idx_t)pSVar4,local_48,local_50);
  pSVar1 = unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>::
           operator->((unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>
                       *)this);
  __p_00._M_t.super___uniq_ptr_impl<duckdb::SortedData,_std::default_delete<duckdb::SortedData>_>.
  _M_t.super__Tuple_impl<0UL,_duckdb::SortedData_*,_std::default_delete<duckdb::SortedData>_>.
  super__Head_base<0UL,_duckdb::SortedData_*,_false>._M_head_impl =
       (__uniq_ptr_data<duckdb::SortedData,_std::default_delete<duckdb::SortedData>,_true,_true>)
       (__uniq_ptr_data<duckdb::SortedData,_std::default_delete<duckdb::SortedData>,_true,_true>)
       local_78._M_head_impl;
  local_78._M_head_impl = (SortedData *)0x0;
  ::std::__uniq_ptr_impl<duckdb::SortedData,_std::default_delete<duckdb::SortedData>_>::reset
            ((__uniq_ptr_impl<duckdb::SortedData,_std::default_delete<duckdb::SortedData>_> *)
             &pSVar1->payload_data,
             (pointer)__p_00._M_t.
                      super___uniq_ptr_impl<duckdb::SortedData,_std::default_delete<duckdb::SortedData>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_duckdb::SortedData_*,_std::default_delete<duckdb::SortedData>_>
                      .super__Head_base<0UL,_duckdb::SortedData_*,_false>._M_head_impl);
  ::std::unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>_>::~unique_ptr
            ((unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>_> *)
             &stack0xffffffffffffff88);
  return (unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>_>)
         (unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>_>)this;
}

Assistant:

unique_ptr<SortedBlock> SortedBlock::CreateSlice(const idx_t start, const idx_t end, idx_t &entry_idx) {
	// Identify blocks/entry indices of this slice
	idx_t start_block_index;
	idx_t start_entry_index;
	GlobalToLocalIndex(start, start_block_index, start_entry_index);
	idx_t end_block_index;
	idx_t end_entry_index;
	GlobalToLocalIndex(end, end_block_index, end_entry_index);
	// Add the corresponding blocks to the result
	auto result = make_uniq<SortedBlock>(buffer_manager, state);
	for (idx_t i = start_block_index; i <= end_block_index; i++) {
		result->radix_sorting_data.push_back(radix_sorting_data[i]->Copy());
	}
	// Reset all blocks that come before block with idx = start_block_idx (slice holds new reference)
	for (idx_t i = 0; i < start_block_index; i++) {
		radix_sorting_data[i]->block = nullptr;
	}
	// Use start and end entry indices to set the boundaries
	entry_idx = start_entry_index;
	D_ASSERT(end_entry_index <= result->radix_sorting_data.back()->count);
	result->radix_sorting_data.back()->count = end_entry_index;
	// Same for the var size sorting data
	if (!sort_layout.all_constant) {
		result->blob_sorting_data = blob_sorting_data->CreateSlice(start_block_index, end_block_index, end_entry_index);
	}
	// And the payload data
	result->payload_data = payload_data->CreateSlice(start_block_index, end_block_index, end_entry_index);
	return result;
}